

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPM2B_SENSITIVE_Unmarshal(TPM2B_SENSITIVE *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT16_Unmarshal(&target->size,buffer,size);
  if (TVar2 == 0) {
    if (target->size == 0) {
      TVar2 = 0;
    }
    else {
      iVar1 = *size;
      TVar2 = TPMT_SENSITIVE_Unmarshal(&target->sensitiveArea,buffer,size);
      if ((TVar2 == 0) && (TVar2 = 0x95, iVar1 - *size == (uint)target->size)) {
        TVar2 = 0;
      }
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPM2B_SENSITIVE_Unmarshal(TPM2B_SENSITIVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    INT32    startSize;
    result = UINT16_Unmarshal((UINT16 *)&(target->size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    // if size equal to 0, the rest of the structure is a zero buffer.  Stop processing
    if(target->size == 0)
        return TPM_RC_SUCCESS;
    startSize = *size;
    result = TPMT_SENSITIVE_Unmarshal((TPMT_SENSITIVE *)&(target->sensitiveArea), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(target->size != (startSize - *size)) return TPM_RC_SIZE;
    return TPM_RC_SUCCESS;
}